

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo-main.cpp
# Opt level: O2

int main(void)

{
  Animal *pAVar1;
  ostream *poVar2;
  pointer ppAVar3;
  _Vector_base<Animal_*,_std::allocator<Animal_*>_> local_88;
  string local_70 [32];
  string local_50 [32];
  
  linktimeplugin::RegistrarBase<Animal>::plugins();
  for (ppAVar3 = local_88._M_impl.super__Vector_impl_data._M_start;
      ppAVar3 != local_88._M_impl.super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
    pAVar1 = *ppAVar3;
    (**pAVar1->_vptr_Animal)(local_50,pAVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,local_50);
    poVar2 = std::operator<<(poVar2,": ");
    (*pAVar1->_vptr_Animal[1])(local_70,pAVar1);
    poVar2 = std::operator<<(poVar2,local_70);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
  }
  std::_Vector_base<Animal_*,_std::allocator<Animal_*>_>::~_Vector_base(&local_88);
  return 0;
}

Assistant:

int main() {
    for (const auto animal : linktimeplugin::plugins<Animal>()) {
        std::cout << animal->name() << ": " << animal->sound() << '\n';
    }

    return EXIT_SUCCESS;
}